

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumhashgenerator.cpp
# Opt level: O3

char * __thiscall SumHashGenerator::hash(SumHashGenerator *this,char *src)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  uint uVar4;
  ulong unaff_RBX;
  ulong __n;
  
  sVar2 = strlen(src);
  if (0 < (int)(uint)sVar2) {
    uVar3 = 0;
    do {
      uVar4 = (int)unaff_RBX + (int)src[uVar3];
      unaff_RBX = (ulong)uVar4;
      uVar3 = uVar3 + 1;
    } while (((uint)sVar2 & 0x7fffffff) != uVar3);
    if (uVar4 == 0) {
      __n = 1;
      unaff_RBX = 0;
      goto LAB_0010234a;
    }
  }
  __n = (unaff_RBX >> 0x1f & 1) + 1;
  uVar3 = unaff_RBX & 0xffffffff;
  do {
    iVar1 = (int)uVar3;
    uVar3 = (ulong)(uint)(iVar1 / 10);
    __n = __n + 1;
  } while (0x12 < iVar1 + 9U);
LAB_0010234a:
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  sprintf(__s,"%d",unaff_RBX & 0xffffffff);
  return __s;
}

Assistant:

char* SumHashGenerator::hash(const char* src)
{
	int len = strlen(src);
	int sumlen = 0;
	int sum;

	for (int i = 0; i < len; ++i) {
		sum += (int)src[i];
	}

	sumlen = getNumberLength(sum);
	char* res = new char[sumlen + 1];
	memset(res, 0x00, sumlen + 1);

	sprintf(res, "%d", sum);

	return res;
}